

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O0

float __thiscall
xray_re::xr_level_ai::vertex_plane_y(xr_level_ai *this,ai_node *node,float x,float z)

{
  bool bVar1;
  float fVar2;
  float a;
  double dVar3;
  float v0;
  float kz;
  float kx;
  float ky;
  float m;
  fvector3 plane;
  float y0;
  float z0;
  float x0;
  float z_local;
  float x_local;
  ai_node *node_local;
  xr_level_ai *this_local;
  
  z0 = z;
  x0 = x;
  _z_local = node;
  node_local = (ai_node *)this;
  unpack_xz(this,node->packed_xz,&y0,&plane.field_0.field_0.z);
  unpack_y(this,_z_local->packed_y,&plane.field_0.field_0.y);
  _vector3<float>::decompress((_vector3<float> *)&ky,_z_local->plane);
  fVar2 = _vector3<float>::square_magnitude((_vector3<float> *)&ky);
  dVar3 = std::sqrt((double)(ulong)(uint)(1.0 / fVar2));
  fVar2 = SUB84(dVar3,0);
  a = m * fVar2;
  bVar1 = equivalent<float>(a,0.0,1e-07);
  if (bVar1) {
    this_local._4_4_ = plane.field_0.field_0.y;
  }
  else {
    this_local._4_4_ =
         plane.field_0.field_0.y -
         ((plane.field_0.field_0.x * fVar2 * z0 + ky * fVar2 * x0 + a * plane.field_0.field_0.y) -
         (plane.field_0.field_0.x * fVar2 * plane.field_0.field_0.z +
         ky * fVar2 * y0 + a * plane.field_0.field_0.y)) / a;
  }
  return this_local._4_4_;
}

Assistant:

float xr_level_ai::vertex_plane_y(const ai_node& node, float x, float z) const
{
	float x0, z0, y0;
	unpack_xz(node.packed_xz, x0, z0);
	unpack_y(node.packed_y, y0);

	fvector3 plane;
	plane.decompress(node.plane);
	float m = std::sqrt(1.f/plane.square_magnitude()), ky = plane.y*m;
	if (equivalent(ky, 0.f, 1e-7f)) {
		return y0;
	} else {
		float kx = plane.x*m;
		float kz = plane.z*m;
		float v0 = kx*x0 + ky*y0 + kz*z0;
		return y0 - (kx*x + ky*y0 + kz*z - v0)/ky;
	}
}